

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
::
nosize_unchecked_emplace_at<std::pair<slang::syntax::SyntaxNode_const*&&,slang::ast::Compilation::SyntaxMetadata&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::syntax::SyntaxNode_*&&,_slang::ast::Compilation::SyntaxMetadata_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  SyntaxMetadata *pSVar6;
  uint uVar7;
  ushort uVar8;
  byte bVar9;
  SyntaxTree *pSVar10;
  NetType *pNVar11;
  SyntaxMetadata *pSVar12;
  undefined3 uVar13;
  UnconnectedDrive UVar14;
  bool bVar15;
  undefined3 uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  
  uVar3 = arrays_->groups_size_mask;
  pgVar4 = arrays_->groups_;
  lVar17 = 1;
  while( true ) {
    pgVar1 = pgVar4 + pos0;
    pgVar2 = pgVar4 + pos0;
    bVar9 = pgVar2->m[0xf].n;
    auVar18[0] = -(pgVar2->m[0].n == '\0');
    auVar18[1] = -(pgVar2->m[1].n == '\0');
    auVar18[2] = -(pgVar2->m[2].n == '\0');
    auVar18[3] = -(pgVar2->m[3].n == '\0');
    auVar18[4] = -(pgVar2->m[4].n == '\0');
    auVar18[5] = -(pgVar2->m[5].n == '\0');
    auVar18[6] = -(pgVar2->m[6].n == '\0');
    auVar18[7] = -(pgVar2->m[7].n == '\0');
    auVar18[8] = -(pgVar2->m[8].n == '\0');
    auVar18[9] = -(pgVar2->m[9].n == '\0');
    auVar18[10] = -(pgVar2->m[10].n == '\0');
    auVar18[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar18[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar18[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar18[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar18[0xf] = -(bVar9 == 0);
    uVar8 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
    if (uVar8 != 0) break;
    pgVar1->m[0xf].n = bVar9 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar17 & uVar3;
    lVar17 = lVar17 + 1;
  }
  uVar7 = 0;
  if (uVar8 != 0) {
    for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  ppVar5 = arrays_->elements_;
  ppVar5[pos0 * 0xf + (ulong)uVar7].first = *args->first;
  pSVar6 = args->second;
  pSVar10 = pSVar6->tree;
  pNVar11 = pSVar6->defaultNetType;
  uVar13 = *(undefined3 *)&pSVar6->field_0x15;
  UVar14 = pSVar6->unconnectedDrive;
  bVar15 = pSVar6->cellDefine;
  uVar16 = *(undefined3 *)&pSVar6->field_0x1d;
  pSVar12 = &ppVar5[pos0 * 0xf + (ulong)uVar7].second;
  pSVar12->timeScale =
       (_Optional_base<slang::TimeScale,_true,_true>)
       (pSVar6->timeScale).super__Optional_base<slang::TimeScale,_true,_true>;
  *(undefined3 *)&pSVar12->field_0x15 = uVar13;
  pSVar12->unconnectedDrive = UVar14;
  pSVar12->cellDefine = bVar15;
  *(undefined3 *)&pSVar12->field_0x1d = uVar16;
  ppVar5[pos0 * 0xf + (ulong)uVar7].second.tree = pSVar10;
  ppVar5[pos0 * 0xf + (ulong)uVar7].second.defaultNetType = pNVar11;
  pgVar1->m[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p = ppVar5 + pos0 * 0xf + (ulong)uVar7;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }